

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_amigahunk.c
# Opt level: O0

void fix_reloc_addends(GlobalVars *gv,LinkedSection *ls)

{
  long in_RSI;
  Reloc *rel;
  lword in_stack_00000020;
  Reloc *in_stack_00000028;
  uint8_t *in_stack_00000030;
  GlobalVars *in_stack_00000038;
  undefined8 local_18;
  
  for (local_18 = *(long **)(in_RSI + 0x88); *local_18 != 0; local_18 = (long *)*local_18) {
    writesection(in_stack_00000038,in_stack_00000030,in_stack_00000028,in_stack_00000020);
  }
  return;
}

Assistant:

static void fix_reloc_addends(struct GlobalVars *gv,struct LinkedSection *ls)
{
  struct Reloc *rel;

  for (rel=(struct Reloc *)ls->relocs.first;
       rel->n.next!=NULL; rel=(struct Reloc *)rel->n.next) {
    writesection(gv,ls->data+rel->offset,rel,rel->addend);
  }
}